

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propname.cpp
# Opt level: O2

char * icu_63::PropNameData::getName(char *nameGroup,int32_t nameIndex)

{
  size_t sVar1;
  char *pcVar2;
  char *__s;
  
  if (-1 < nameIndex) {
    if (nameIndex < *nameGroup) {
      for (; __s = nameGroup + 1, 0 < nameIndex; nameIndex = nameIndex + -1) {
        sVar1 = strlen(__s);
        nameGroup = __s + sVar1;
      }
      pcVar2 = (char *)0x0;
      if (*__s != '\0') {
        pcVar2 = __s;
      }
    }
    else {
      pcVar2 = (char *)0x0;
    }
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

const char *PropNameData::getName(const char *nameGroup, int32_t nameIndex) {
    int32_t numNames=*nameGroup++;
    if(nameIndex<0 || numNames<=nameIndex) {
        return NULL;
    }
    // Skip nameIndex names.
    for(; nameIndex>0; --nameIndex) {
        nameGroup=uprv_strchr(nameGroup, 0)+1;
    }
    if(*nameGroup==0) {
        return NULL;  // no name (Property[Value]Aliases.txt has "n/a")
    }
    return nameGroup;
}